

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::ArenaTest_ReallocFastPath_Test::TestBody
          (ArenaTest_ReallocFastPath_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  uintptr_t extend_allocated;
  void *extend;
  uintptr_t initial_allocated;
  void *initial;
  upb_Arena *arena;
  ArenaTest_ReallocFastPath_Test *this_local;
  
  arena = (upb_Arena *)this;
  initial = upb_Arena_Init((void *)0x0,0x1000,&upb_alloc_global);
  initial_allocated = (uintptr_t)::upb_Arena_Malloc((upb_Arena *)initial,0x200);
  extend = (void *)upb_Arena_SpaceAllocated((upb_Arena *)initial,(size_t *)0x0);
  extend_allocated =
       (uintptr_t)upb_Arena_Realloc((upb_Arena *)initial,(void *)initial_allocated,0x200,0x400);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )upb_Arena_SpaceAllocated((upb_Arena *)initial,(size_t *)0x0);
  testing::internal::EqHelper::Compare<void_*,_void_*,_nullptr>
            ((EqHelper *)local_48,"initial","extend",(void **)&initial_allocated,
             (void **)&extend_allocated);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_78,"initial_allocated","extend_allocated",(unsigned_long *)&extend,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  upb_Arena_Free((upb_Arena *)initial);
  return;
}

Assistant:

TEST(ArenaTest, ReallocFastPath) {
  upb_Arena* arena = upb_Arena_Init(nullptr, 4096, &upb_alloc_global);
  void* initial = upb_Arena_Malloc(arena, 512);
  uintptr_t initial_allocated = upb_Arena_SpaceAllocated(arena, nullptr);
  void* extend = upb_Arena_Realloc(arena, initial, 512, 1024);
  uintptr_t extend_allocated = upb_Arena_SpaceAllocated(arena, nullptr);
  EXPECT_EQ(initial, extend);
  EXPECT_EQ(initial_allocated, extend_allocated);
  upb_Arena_Free(arena);
}